

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::Recycled<Kernel::UnificationConstraintStack,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Kernel::UnificationConstraintStack,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *this)

{
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> _Var1;
  Stack<std::unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>_>
  *this_00;
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> local_10;
  
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
       ._M_t.
       super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
       .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
  if (((_Var1._M_head_impl != (UnificationConstraintStack *)0x0) &&
      (*(long *)&(_Var1._M_head_impl)->_cont != 0)) &&
     (Recycled<Kernel::UnificationConstraintStack,Lib::DefaultReset,Lib::DefaultKeepRecycled>::
      memAlive == '\x01')) {
    *(UnificationConstraint **)((long)&(_Var1._M_head_impl)->_cont + 0x10) =
         *(UnificationConstraint **)((long)&(_Var1._M_head_impl)->_cont + 8);
    this_00 = mem();
    local_10._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
         ._M_t.
         super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
         .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
    .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
         (UnificationConstraintStack *)0x0;
    Stack<std::unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>_>
    ::push(this_00,(unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                    *)&local_10);
    std::
    unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
    ::~unique_ptr((unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                   *)&local_10);
  }
  std::
  unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }